

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O2

void __thiscall dgMatrix::dgMatrix(dgMatrix *this,dgQuaternion *rotation,dgVector *position)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  dgTemplateVector<float> local_28;
  
  fVar1 = (float)rotation->m_q1;
  fVar2 = (float)rotation->m_q0;
  fVar3 = (float)rotation->m_q3;
  fVar5 = fVar1 + fVar1;
  fVar7 = fVar3 * (fVar3 + fVar3);
  fVar4 = (float)rotation->m_q2;
  fVar6 = fVar4 + fVar4;
  fVar8 = (fVar3 + fVar3) * fVar2;
  dgVector::dgVector((dgVector *)&local_28,(HaF32)((1.0 - fVar4 * fVar6) - fVar7),
                     (HaF32)(fVar5 * fVar4 + fVar8),(HaF32)(fVar5 * fVar3 - fVar6 * fVar2),0.0);
  fVar1 = 1.0 - fVar1 * fVar5;
  (this->m_front).super_dgTemplateVector<float>.m_x = local_28.m_x;
  (this->m_front).super_dgTemplateVector<float>.m_y = local_28.m_y;
  (this->m_front).super_dgTemplateVector<float>.m_z = local_28.m_z;
  (this->m_front).super_dgTemplateVector<float>.m_w = local_28.m_w;
  dgVector::dgVector((dgVector *)&local_28,(HaF32)(fVar5 * fVar4 - fVar8),(HaF32)(fVar1 - fVar7),
                     (HaF32)(fVar6 * fVar3 + fVar5 * fVar2),0.0);
  (this->m_up).super_dgTemplateVector<float>.m_x = local_28.m_x;
  (this->m_up).super_dgTemplateVector<float>.m_y = local_28.m_y;
  (this->m_up).super_dgTemplateVector<float>.m_z = local_28.m_z;
  (this->m_up).super_dgTemplateVector<float>.m_w = local_28.m_w;
  dgVector::dgVector((dgVector *)&local_28,(HaF32)(fVar5 * fVar3 + fVar6 * fVar2),
                     (HaF32)(fVar6 * fVar3 - fVar5 * fVar2),(HaF32)(fVar1 - fVar4 * fVar6),0.0);
  (this->m_right).super_dgTemplateVector<float>.m_x = local_28.m_x;
  (this->m_right).super_dgTemplateVector<float>.m_y = local_28.m_y;
  (this->m_right).super_dgTemplateVector<float>.m_z = local_28.m_z;
  (this->m_right).super_dgTemplateVector<float>.m_w = local_28.m_w;
  fVar1 = (position->super_dgTemplateVector<float>).m_y;
  (this->m_posit).super_dgTemplateVector<float>.m_x = (position->super_dgTemplateVector<float>).m_x;
  (this->m_posit).super_dgTemplateVector<float>.m_y = fVar1;
  (this->m_posit).super_dgTemplateVector<float>.m_z = (position->super_dgTemplateVector<float>).m_z;
  (this->m_posit).super_dgTemplateVector<float>.m_w = 1.0;
  return;
}

Assistant:

dgMatrix::dgMatrix (const dgQuaternion &rotation, const dgVector &position)
{
	hacd::HaF32 x2 = hacd::HaF32 (2.0f) * rotation.m_q1 * rotation.m_q1;
	hacd::HaF32 y2 = hacd::HaF32 (2.0f) * rotation.m_q2 * rotation.m_q2;
	hacd::HaF32 z2 = hacd::HaF32 (2.0f) * rotation.m_q3 * rotation.m_q3;

#ifdef _DEBUG
	hacd::HaF32 w2 = hacd::HaF32 (2.0f) * rotation.m_q0 * rotation.m_q0;
	HACD_ASSERT (dgAbsf (w2 + x2 + y2 + z2 - hacd::HaF32(2.0f)) <hacd::HaF32 (1.0e-3f));
#endif

	hacd::HaF32 xy = hacd::HaF32 (2.0f) * rotation.m_q1 * rotation.m_q2;
	hacd::HaF32 xz = hacd::HaF32 (2.0f) * rotation.m_q1 * rotation.m_q3;
	hacd::HaF32 xw = hacd::HaF32 (2.0f) * rotation.m_q1 * rotation.m_q0;
	hacd::HaF32 yz = hacd::HaF32 (2.0f) * rotation.m_q2 * rotation.m_q3;
	hacd::HaF32 yw = hacd::HaF32 (2.0f) * rotation.m_q2 * rotation.m_q0;
	hacd::HaF32 zw = hacd::HaF32 (2.0f) * rotation.m_q3 * rotation.m_q0;

	m_front = dgVector (hacd::HaF32(1.0f) - y2 - z2, xy + zw,                   xz - yw				    , hacd::HaF32(0.0f));
	m_up    = dgVector (xy - zw,                   hacd::HaF32(1.0f) - x2 - z2, yz + xw					, hacd::HaF32(0.0f));
	m_right = dgVector (xz + yw,                   yz - xw,                   hacd::HaF32(1.0f) - x2 - y2 , hacd::HaF32(0.0f));


	m_posit.m_x = position.m_x;
	m_posit.m_y = position.m_y;
	m_posit.m_z = position.m_z;
	m_posit.m_w = hacd::HaF32(1.0f);
}